

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

lys_module *
ly_ctx_load_sub_module
          (ly_ctx *ctx,lys_module *module,char *name,char *revision,int implement,
          unres_schema *unres)

{
  int iVar1;
  ly_ctx *plVar2;
  LY_ERR *pLVar3;
  lys_revision *plVar4;
  LYS_INFORMAT local_64;
  code *pcStack_60;
  LYS_INFORMAT format;
  _func_void_void_ptr *module_data_free;
  char *pcStack_50;
  int i;
  char *module_data;
  lys_module *mod;
  unres_schema *unres_local;
  char *pcStack_30;
  int implement_local;
  char *revision_local;
  char *name_local;
  lys_module *module_local;
  ly_ctx *ctx_local;
  
  pcStack_60 = (code *)0x0;
  local_64 = LYS_IN_UNKNOWN;
  mod = (lys_module *)unres;
  unres_local._4_4_ = implement;
  pcStack_30 = revision;
  revision_local = name;
  name_local = (char *)module;
  module_local = (lys_module *)ctx;
  if (module == (lys_module *)0x0) {
    for (module_data_free._4_4_ = 0; module_data_free._4_4_ < 5;
        module_data_free._4_4_ = module_data_free._4_4_ + 1) {
      iVar1 = ly_strequal_(revision_local,internal_modules[module_data_free._4_4_].name);
      if ((iVar1 != 0) &&
         ((pcStack_30 == (char *)0x0 ||
          (iVar1 = ly_strequal_(pcStack_30,internal_modules[module_data_free._4_4_].revision),
          iVar1 != 0)))) {
        plVar2 = (ly_ctx *)ly_ctx_get_module((ly_ctx *)module_local,revision_local,pcStack_30);
        return (lys_module *)plVar2;
      }
    }
    if (pcStack_30 != (char *)0x0) {
      for (module_data_free._4_4_ = 5; module_data = (char *)0x0,
          module_data_free._4_4_ < *(int *)((long)&module_local[0x8b].ns + 4);
          module_data_free._4_4_ = module_data_free._4_4_ + 1) {
        module_data = (char *)(&((module_local[0x8c].ctx)->dict).recs[0].next)
                              [module_data_free._4_4_];
        iVar1 = ly_strequal_(revision_local,((dict_rec *)module_data)->value);
        if (((iVar1 != 0) && (module_data[0x41] != '\0')) &&
           (iVar1 = strcmp(pcStack_30,*(char **)(module_data + 0x50)), iVar1 == 0)) break;
      }
      if (module_data != (char *)0x0) {
        iVar1 = lys_set_implemented((lys_module *)module_data);
        if (iVar1 != 0) {
          module_data = (char *)0x0;
        }
        return (lys_module *)(ly_ctx *)module_data;
      }
    }
  }
  if (module_local[0x8c].ref == (char *)0x0) {
    module_data = (char *)lyp_search_file((ly_ctx *)module_local,(lys_module *)name_local,
                                          revision_local,pcStack_30,unres_local._4_4_,
                                          (unres_schema *)mod);
  }
  else {
    if (name_local == (char *)0x0) {
      pcStack_50 = (char *)(*(code *)module_local[0x8c].ref)
                                     (revision_local,pcStack_30,0,0,module_local[0x8c].org,&local_64
                                      ,&stack0xffffffffffffffa0);
    }
    else {
      module_data = (char *)lys_main_module((lys_module *)name_local);
      if (((lys_module *)module_data)->rev_size == '\0') {
        plVar4 = (lys_revision *)0x0;
      }
      else {
        plVar4 = ((lys_module *)module_data)->rev;
      }
      pcStack_50 = (char *)(*(code *)module_local[0x8c].ref)
                                     (((lys_module *)module_data)->name,plVar4,revision_local,
                                      pcStack_30,module_local[0x8c].org,&local_64,
                                      &stack0xffffffffffffffa0,plVar4,module_local[0x8c].ref,
                                      ((lys_module *)module_data)->name);
    }
    if (pcStack_50 == (char *)0x0) {
      if ((name_local == (char *)0x0) && (pcStack_30 == (char *)0x0)) {
        module_data = (char *)ly_ctx_get_module_by
                                        ((ly_ctx *)module_local,revision_local,8,(char *)0x0,1);
        if (((lys_module *)module_data != (lys_module *)0x0) &&
           (((byte)((lys_module *)module_data)->field_0x40 >> 6 & 1) != 0)) {
          lys_set_enabled((lys_module *)module_data);
        }
        return (lys_module *)(ly_ctx *)module_data;
      }
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_ESYS;
      ly_log(LY_LLERR,"User module retrieval callback failed!");
      return (lys_module *)(ly_ctx *)0x0;
    }
    if (name_local == (char *)0x0) {
      module_data = (char *)lys_parse_mem((ly_ctx *)module_local,pcStack_50,local_64);
    }
    else {
      module_data = (char *)lys_sub_parse_mem((lys_module *)name_local,pcStack_50,local_64,
                                              (unres_schema *)mod);
    }
    if (pcStack_60 != (code *)0x0) {
      (*pcStack_60)(pcStack_50);
    }
  }
  return (lys_module *)(ly_ctx *)module_data;
}

Assistant:

const struct lys_module *
ly_ctx_load_sub_module(struct ly_ctx *ctx, struct lys_module *module, const char *name, const char *revision,
                       int implement, struct unres_schema *unres)
{
    const struct lys_module *mod;
    char *module_data;
    int i;
    void (*module_data_free)(void *module_data) = NULL;
    LYS_INFORMAT format = LYS_IN_UNKNOWN;

    if (!module) {
        /* exception for internal modules */
        for (i = 0; i < INTERNAL_MODULES_COUNT; i++) {
            if (ly_strequal(name, internal_modules[i].name, 0)) {
                if (!revision || ly_strequal(revision, internal_modules[i].revision, 0)) {
                    /* return internal module */
                    return (struct lys_module *)ly_ctx_get_module(ctx, name, revision);
                }
            }
        }
        if (revision) {
            /* try to get the schema with the specific revision from the context,
             * include the disabled modules in the search to avoid their duplication,
             * they are enabled by the subsequent call to lys_set_implemented() */
            for (i = INTERNAL_MODULES_COUNT, mod = NULL; i < ctx->models.used; i++) {
                mod = ctx->models.list[i]; /* shortcut */
                if (ly_strequal(name, mod->name, 0) && mod->rev_size && !strcmp(revision, mod->rev[0].date)) {
                    break;
                }
                mod = NULL;
            }
            if (mod) {
                /* we get such a module, make it implemented */
                if (lys_set_implemented(mod)) {
                    /* the schema cannot be implemented */
                    mod = NULL;
                }
                return mod;
            }
        }
    }

    if (ctx->imp_clb) {
        if (module) {
            mod = lys_main_module(module);
            module_data = ctx->imp_clb(mod->name, (mod->rev_size ? mod->rev[0].date : NULL), name, revision, ctx->imp_clb_data, &format, &module_data_free);
        } else {
            module_data = ctx->imp_clb(name, revision, NULL, NULL, ctx->imp_clb_data, &format, &module_data_free);
        }
        if (!module_data) {
            if (module || revision) {
                /* we already know that the specified revision is not present in context, and we have no other
                 * option in case of submodules */
                LOGERR(LY_ESYS, "User module retrieval callback failed!");
                return NULL;
            } else {
                /* get the newest revision from the context */
                mod = ly_ctx_get_module_by(ctx, name, offsetof(struct lys_module, name), revision, 1);
                if (mod && mod->disabled) {
                    /* enable the required module */
                    lys_set_enabled(mod);
                }
                return mod;
            }
        }

        if (module) {
            mod = (struct lys_module *)lys_sub_parse_mem(module, module_data, format, unres);
        } else {
            mod = (struct lys_module *)lys_parse_mem(ctx, module_data, format);
        }

        if (module_data_free) {
            module_data_free(module_data);
        }
    } else {
        mod = lyp_search_file(ctx, module, name, revision, implement, unres);
    }

    return mod;
}